

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O0

int Wln_RetPropDelay_rec(Wln_Ret_t *p,int iObj)

{
  int iVar1;
  int b;
  int *piVar2;
  int *piVar3;
  bool bVar4;
  int *pDelay;
  int *pLink;
  int local_20;
  int iFanin;
  int k;
  int iObj_local;
  Wln_Ret_t *p_local;
  
  piVar2 = Vec_IntEntryP(&p->vPathDelays,iObj);
  if (*piVar2 < 0) {
    *piVar2 = 0;
    local_20 = 0;
    while( true ) {
      iVar1 = Wln_ObjFaninNum(p->pNtk,iObj);
      bVar4 = false;
      if (local_20 < iVar1) {
        piVar3 = Wln_RetFanins(p,iObj);
        pLink._4_4_ = piVar3[local_20 << 1];
        piVar3 = Wln_RetFanins(p,iObj);
        pDelay = piVar3 + (long)(local_20 << 1) + 1;
        bVar4 = pDelay != (int *)0x0;
      }
      if (!bVar4) break;
      if (((pLink._4_4_ != 0) &&
          ((iVar1 = Wln_ObjFaninNum(p->pNtk,pLink._4_4_), iVar1 != 0 ||
           (iVar1 = Wln_ObjIsCi(p->pNtk,pLink._4_4_), iVar1 != 0)))) &&
         ((iVar1 = Wln_ObjIsFf(p->pNtk,iObj), iVar1 == 0 || (local_20 < 1)))) {
        if (*pDelay == 0) {
          iVar1 = *piVar2;
          b = Wln_RetPropDelay_rec(p,pLink._4_4_);
          iVar1 = Abc_MaxInt(iVar1,b);
          *piVar2 = iVar1;
        }
        else {
          iVar1 = Abc_MaxInt(*piVar2,0);
          *piVar2 = iVar1;
        }
      }
      local_20 = local_20 + 1;
    }
    iVar1 = Vec_IntEntry(&p->vNodeDelays,iObj);
    *piVar2 = iVar1 + *piVar2;
    p_local._4_4_ = *piVar2;
  }
  else {
    p_local._4_4_ = *piVar2;
  }
  return p_local._4_4_;
}

Assistant:

int Wln_RetPropDelay_rec( Wln_Ret_t * p, int iObj )
{
    int k, iFanin, * pLink, * pDelay = Vec_IntEntryP( &p->vPathDelays, iObj );
    if ( *pDelay >= 0 )
        return *pDelay;
    *pDelay = 0;
    Wln_RetForEachFanin( p, iObj, iFanin, pLink, k )
    {
        if ( Wln_ObjIsFf(p->pNtk, iObj) && k > 0 )
            continue;
        if ( pLink[0] )
            *pDelay = Abc_MaxInt(*pDelay, 0);
        else
            *pDelay = Abc_MaxInt(*pDelay, Wln_RetPropDelay_rec(p, iFanin));
    }
    *pDelay += Vec_IntEntry( &p->vNodeDelays, iObj );
    return *pDelay;
}